

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::node_output_start
               (xml_buffered_writer *writer,xml_node_struct *node,char_t *indent,
               size_t indent_length,uint flags,uint depth)

{
  size_t __n;
  size_t sVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *local_50;
  char_t *name;
  char_t *default_name;
  uint depth_local;
  uint flags_local;
  size_t indent_length_local;
  char_t *indent_local;
  xml_node_struct *node_local;
  xml_buffered_writer *writer_local;
  
  if (node->name == (char_t *)0x0) {
    local_50 = ":anonymous";
  }
  else {
    local_50 = node->name;
  }
  __n = indent_length;
  xml_buffered_writer::write(writer,0x3c,indent,indent_length);
  xml_buffered_writer::write_string(writer,local_50);
  __buf = extraout_RDX;
  if (node->first_attribute != (xml_attribute_struct *)0x0) {
    node_output_attributes(writer,node,indent,indent_length,flags,depth);
    __n = indent_length;
    __buf = extraout_RDX_00;
  }
  if (node->value == (char_t *)0x0) {
    if (node->first_child == (xml_node_struct *)0x0) {
      if ((flags & 0x80) == 0) {
        if ((flags & 4) == 0) {
          xml_buffered_writer::write(writer,0x20,__buf,__n);
        }
        xml_buffered_writer::write(writer,0x2f,(void *)0x3e,__n);
        writer_local._7_1_ = false;
      }
      else {
        sVar1 = 0x2f;
        xml_buffered_writer::write(writer,0x3e,(void *)0x3c,0x2f);
        xml_buffered_writer::write_string(writer,local_50);
        xml_buffered_writer::write(writer,0x3e,__buf_00,sVar1);
        writer_local._7_1_ = false;
      }
    }
    else {
      xml_buffered_writer::write(writer,0x3e,__buf,__n);
      writer_local._7_1_ = true;
    }
  }
  else {
    xml_buffered_writer::write(writer,0x3e,__buf,__n);
    sVar1 = (size_t)flags;
    text_output(writer,node->value,ctx_special_pcdata,flags);
    if (node->first_child == (xml_node_struct *)0x0) {
      xml_buffered_writer::write(writer,0x3c,(void *)0x2f,sVar1);
      xml_buffered_writer::write_string(writer,local_50);
      xml_buffered_writer::write(writer,0x3e,__buf_01,sVar1);
      writer_local._7_1_ = false;
    }
    else {
      writer_local._7_1_ = true;
    }
  }
  return writer_local._7_1_;
}

Assistant:

PUGI__FN bool node_output_start(xml_buffered_writer& writer, xml_node_struct* node, const char_t* indent, size_t indent_length, unsigned int flags, unsigned int depth)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");
		const char_t* name = node->name ? node->name + 0 : default_name;

		writer.write('<');
		writer.write_string(name);

		if (node->first_attribute)
			node_output_attributes(writer, node, indent, indent_length, flags, depth);

		// element nodes can have value if parse_embed_pcdata was used
		if (!node->value)
		{
			if (!node->first_child)
			{
				if (flags & format_no_empty_element_tags)
				{
					writer.write('>', '<', '/');
					writer.write_string(name);
					writer.write('>');

					return false;
				}
				else
				{
					if ((flags & format_raw) == 0)
						writer.write(' ');

					writer.write('/', '>');

					return false;
				}
			}
			else
			{
				writer.write('>');

				return true;
			}
		}
		else
		{
			writer.write('>');

			text_output(writer, node->value, ctx_special_pcdata, flags);

			if (!node->first_child)
			{
				writer.write('<', '/');
				writer.write_string(name);
				writer.write('>');

				return false;
			}
			else
			{
				return true;
			}
		}
	}